

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  Index source;
  undefined1 *puVar1;
  node_ptr plVar2;
  pointer p_1;
  pointer pIVar3;
  pointer p;
  ulong uVar4;
  Column_support *pCVar5;
  
  if ((this->reducedMatrixR_).
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_false,_true,_false,_true>_>_>_>
      .rowSwapped_ == true) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>
    ::_orderRows(&(this->reducedMatrixR_).
                  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_false,_true,_false,_true>_>_>_>
                );
  }
  pIVar3 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar5 = &pIVar3[target].column_;
  puVar1 = *(undefined1 **)&(pCVar5->super_type).data_.root_plus_size_;
  if ((Column_support *)puVar1 != pCVar5 && puVar1 != (undefined1 *)0x0) {
    plVar2 = *(node_ptr *)((long)&pIVar3[target].column_.super_type.data_ + 8);
    if (plVar2 == (node_ptr)0x0) {
LAB_0011e5af:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
    uVar4 = (ulong)*(uint *)&plVar2[1].next_;
    if (uVar4 != 0xffffffff) {
      source = (this->pivotToColumnIndex_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
      while( true ) {
        if (source == 0xffffffff) {
          (this->pivotToColumnIndex_).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] = target;
          RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
          ::_update_barcode((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                             *)this,(ID_index)uVar4,eventIndex);
          return;
        }
        _reduce_column_by(this,target,source);
        puVar1 = *(undefined1 **)&(pCVar5->super_type).data_.root_plus_size_;
        if ((puVar1 == (undefined1 *)0x0) || ((Column_support *)puVar1 == pCVar5)) break;
        plVar2 = *(node_ptr *)((long)&pIVar3[target].column_.super_type.data_ + 8);
        if (plVar2 == (node_ptr)0x0) goto LAB_0011e5af;
        uVar4 = (ulong)*(uint *)&plVar2[1].next_;
        if (uVar4 == 0xffffffff) break;
        source = (this->pivotToColumnIndex_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4];
      }
      pIVar3 = (this->reducedMatrixR_).matrix_.
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::_add_bar((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
              *)this,pIVar3[target].super_Column_dimension_option.dim_,eventIndex);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}